

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void upb::generator::WriteMiniTableSource
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Output *output)

{
  pointer pEVar1;
  pointer pFVar2;
  pointer pMVar3;
  upb_MessageDef *extraout_RDX;
  upb_MessageDef *extraout_RDX_00;
  upb_MessageDef *extraout_RDX_01;
  upb_MessageDef *extraout_RDX_02;
  upb_EnumDef *extraout_RDX_03;
  upb_MessageDef *extraout_RDX_04;
  MessageDefPtr MVar4;
  upb_FieldDef *extraout_RDX_05;
  upb_MessageDef *extraout_RDX_06;
  upb_MessageDef *extraout_RDX_07;
  upb_MessageDef *extraout_RDX_08;
  upb_EnumDef *extraout_RDX_09;
  EnumDefPtr e;
  upb_EnumDef *extraout_RDX_10;
  upb_MessageDef *extraout_RDX_11;
  upb_FieldDef *extraout_RDX_12;
  FieldDefPtr ext;
  upb_FieldDef *extraout_RDX_13;
  upb_FileDef *extraout_RDX_14;
  iterator __begin3;
  pointer pMVar5;
  pointer pFVar6;
  pointer pEVar7;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string local_a0;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  
  WriteMiniTableSourceIncludes(file,options,output);
  SortedMessages(&messages,file);
  SortedExtensions(&extensions,file);
  SortedEnums(&enums,file,kClosedEnums);
  pMVar3 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  MVar4.ptr_ = extraout_RDX;
  pMVar5 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (options->one_output_per_message == false) {
    for (; pEVar1 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
        pEVar7 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl
                 .super__Vector_impl_data._M_start, pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      anon_unknown_5::WriteMessage(pMVar5->ptr_,pools,options,output);
      MVar4.ptr_ = extraout_RDX_01;
    }
    for (; pFVar2 = extensions.
                    super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
                    super__Vector_impl_data._M_finish,
        pFVar6 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                 _M_impl.super__Vector_impl_data._M_start, pEVar7 != pEVar1; pEVar7 = pEVar7 + 1) {
      anon_unknown_5::WriteEnum(pEVar7->ptr_,output);
      MVar4.ptr_ = extraout_RDX_02;
    }
    for (; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1) {
      anon_unknown_5::WriteExtension(pools,pFVar6->ptr_,output);
      MVar4.ptr_ = extraout_RDX_04;
    }
  }
  else {
    for (; pEVar1 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_finish, pMVar5 != pMVar3; pMVar5 = pMVar5 + 1
        ) {
      (anonymous_namespace)::MessagePtrVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pMVar5->ptr_,MVar4);
      format._M_str = "extern const upb_MiniTable* $0;\n";
      format._M_len = 0x20;
      Output::operator()(output,format,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      MVar4.ptr_ = extraout_RDX_00;
    }
    for (pEVar7 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar2 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                 _M_impl.super__Vector_impl_data._M_finish, pEVar7 != pEVar1; pEVar7 = pEVar7 + 1) {
      (anonymous_namespace)::EnumVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pEVar7->ptr_,(EnumDefPtr)MVar4.ptr_);
      format_00._M_str = "extern const upb_MiniTableEnum $0;\n";
      format_00._M_len = 0x23;
      Output::operator()(output,format_00,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      MVar4.ptr_ = (upb_MessageDef *)extraout_RDX_03;
    }
    for (pFVar6 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                  ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1)
    {
      (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pFVar6->ptr_,(FieldDefPtr)MVar4.ptr_);
      format_01._M_str = "extern const upb_MiniTableExtension $0;\n";
      format_01._M_len = 0x28;
      Output::operator()(output,format_01,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      MVar4.ptr_ = (upb_MessageDef *)extraout_RDX_05;
    }
  }
  if (messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)messages.
                         super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)messages.
                         super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    format_02._M_str = "static const upb_MiniTable *$0[$1] = {\n";
    format_02._M_len = 0x27;
    Output::operator()(output,format_02,(char (*) [16])"messages_layout",(unsigned_long *)&local_a0)
    ;
    pMVar3 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    MVar4.ptr_ = extraout_RDX_06;
    for (pMVar5 = messages.
                  super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      (anonymous_namespace)::MessageVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pMVar5->ptr_,MVar4);
      format_03._M_str = "  &$0,\n";
      format_03._M_len = 7;
      Output::operator()(output,format_03,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      MVar4.ptr_ = extraout_RDX_07;
    }
    format_04._M_str = "};\n";
    format_04._M_len = 3;
    Output::operator()<>(output,format_04);
    format_05._M_str = "\n";
    format_05._M_len = 1;
    Output::operator()<>(output,format_05);
    MVar4.ptr_ = extraout_RDX_08;
  }
  if (enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    format_06._M_str = "static const upb_MiniTableEnum *$0[$1] = {\n";
    format_06._M_len = 0x2b;
    Output::operator()(output,format_06,(char (*) [13])"enums_layout",(unsigned_long *)&local_a0);
    pEVar1 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    e.ptr_ = extraout_RDX_09;
    for (pEVar7 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                  _M_impl.super__Vector_impl_data._M_start; pEVar7 != pEVar1; pEVar7 = pEVar7 + 1) {
      (anonymous_namespace)::EnumVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pEVar7->ptr_,e);
      format_07._M_str = "  &$0,\n";
      format_07._M_len = 7;
      Output::operator()(output,format_07,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      e.ptr_ = extraout_RDX_10;
    }
    format_08._M_str = "};\n";
    format_08._M_len = 3;
    Output::operator()<>(output,format_08);
    format_09._M_str = "\n";
    format_09._M_len = 1;
    Output::operator()<>(output,format_09);
    MVar4.ptr_ = extraout_RDX_11;
  }
  if (extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p =
         (pointer)((long)extensions.
                         super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)extensions.
                         super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3);
    format_10._M_str = "\nstatic const upb_MiniTableExtension *$0[$1] = {\n";
    format_10._M_len = 0x31;
    Output::operator()(output,format_10,(char (*) [18])"extensions_layout",
                       (unsigned_long *)&local_a0);
    pFVar2 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ext.ptr_ = extraout_RDX_12;
    for (pFVar6 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                  ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1)
    {
      (anonymous_namespace)::ExtensionVarName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)pFVar6->ptr_,ext);
      format_11._M_str = "  &$0,\n";
      format_11._M_len = 7;
      Output::operator()(output,format_11,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      ext.ptr_ = extraout_RDX_13;
    }
    format_12._M_str = "};\n\n";
    format_12._M_len = 4;
    Output::operator()<>(output,format_12);
    MVar4.ptr_ = (upb_MessageDef *)extraout_RDX_14;
  }
  (anonymous_namespace)::FileVarName_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)file.ptr_,(FileDefPtr)MVar4.ptr_);
  format_13._M_str = "const upb_MiniTableFile $0 = {\n";
  format_13._M_len = 0x1f;
  Output::operator()(output,format_13,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_a0._M_dataplus._M_p = "messages_layout";
  if (messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_14._M_str = "  $0,\n";
  format_14._M_len = 6;
  Output::operator()(output,format_14,(char **)&local_a0);
  local_a0._M_dataplus._M_p = "enums_layout";
  if (enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_15._M_str = "  $0,\n";
  format_15._M_len = 6;
  Output::operator()(output,format_15,(char **)&local_a0);
  local_a0._M_dataplus._M_p = "extensions_layout";
  if (extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = "NULL";
  }
  format_16._M_str = "  $0,\n";
  format_16._M_len = 6;
  Output::operator()(output,format_16,(char **)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)messages.
                       super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)messages.
                       super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  format_17._M_str = "  $0,\n";
  format_17._M_len = 6;
  Output::operator()(output,format_17,(unsigned_long *)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  format_18._M_str = "  $0,\n";
  format_18._M_len = 6;
  Output::operator()(output,format_18,(unsigned_long *)&local_a0);
  local_a0._M_dataplus._M_p =
       (pointer)((long)extensions.
                       super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)extensions.
                       super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  format_19._M_str = "  $0,\n";
  format_19._M_len = 6;
  Output::operator()(output,format_19,(unsigned_long *)&local_a0);
  format_20._M_str = "};\n\n";
  format_20._M_len = 4;
  Output::operator()<>(output,format_20);
  format_21._M_str = "#include \"upb/port/undef.inc\"\n";
  format_21._M_len = 0x1e;
  Output::operator()<>(output,format_21);
  format_22._M_str = "\n";
  format_22._M_len = 1;
  Output::operator()<>(output,format_22);
  std::_Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~_Vector_base
            (&enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>);
  std::_Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~_Vector_base
            (&extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>);
  std::_Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~_Vector_base
            (&messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>);
  return;
}

Assistant:

void WriteMiniTableSource(const DefPoolPair& pools, upb::FileDefPtr file,
                          const MiniTableOptions& options, Output& output) {
  WriteMiniTableSourceIncludes(file, options, output);

  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);

  if (options.one_output_per_message) {
    for (auto message : messages) {
      output("extern const upb_MiniTable* $0;\n", MessagePtrVarName(message));
    }
    for (const auto e : enums) {
      output("extern const upb_MiniTableEnum $0;\n", EnumVarName(e));
    }
    for (const auto ext : extensions) {
      output("extern const upb_MiniTableExtension $0;\n",
             ExtensionVarName(ext));
    }
  } else {
    for (auto message : messages) {
      WriteMessage(message, pools, options, output);
    }
    for (const auto e : enums) {
      WriteEnum(e, output);
    }
    for (const auto ext : extensions) {
      WriteExtension(pools, ext, output);
    }
  }

  // Messages.
  if (!messages.empty()) {
    output("static const upb_MiniTable *$0[$1] = {\n", kMessagesInit,
           messages.size());
    for (auto message : messages) {
      output("  &$0,\n", MessageVarName(message));
    }
    output("};\n");
    output("\n");
  }

  // Enums.
  if (!enums.empty()) {
    output("static const upb_MiniTableEnum *$0[$1] = {\n", kEnumsInit,
           enums.size());
    for (const auto e : enums) {
      output("  &$0,\n", EnumVarName(e));
    }
    output("};\n");
    output("\n");
  }

  if (!extensions.empty()) {
    // Extensions.
    output(
        "\n"
        "static const upb_MiniTableExtension *$0[$1] = {\n",
        kExtensionsInit, extensions.size());

    for (auto ext : extensions) {
      output("  &$0,\n", ExtensionVarName(ext));
    }

    output(
        "};\n"
        "\n");
  }

  output("const upb_MiniTableFile $0 = {\n", FileVarName(file));
  output("  $0,\n", messages.empty() ? "NULL" : kMessagesInit);
  output("  $0,\n", enums.empty() ? "NULL" : kEnumsInit);
  output("  $0,\n", extensions.empty() ? "NULL" : kExtensionsInit);
  output("  $0,\n", messages.size());
  output("  $0,\n", enums.size());
  output("  $0,\n", extensions.size());
  output("};\n\n");

  output("#include \"upb/port/undef.inc\"\n");
  output("\n");
}